

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

int64_t __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::get_int64_value(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                  *this,error_code *ec)

{
  binary_iterator_source<(anonymous_namespace)::MyIterator> *this_00;
  byte *pbVar1;
  byte bVar2;
  uint64_t uVar3;
  type_conflict2 tVar4;
  ulong uVar5;
  byte bVar6;
  uint8_t b;
  uint8_t buf_2 [2];
  uint8_t buf [4];
  uint8_t buf_1 [8];
  
  pbVar1 = (this->source_).current_.p_;
  if (pbVar1 != (this->source_).end_.p_) {
    bVar6 = *pbVar1;
    bVar2 = bVar6 >> 5;
    if (bVar2 == 0) {
      uVar3 = get_uint64_value(this,ec);
      if (ec->_M_value != 0) {
        return 0;
      }
      if (0 < (long)uVar3) {
        return uVar3;
      }
      return 0;
    }
    if (bVar2 != 1) {
      return 0;
    }
    this_00 = &this->source_;
    bVar6 = bVar6 & 0x1f;
    binary_iterator_source<(anonymous_namespace)::MyIterator>::ignore(this_00,(size_t)ec);
    switch(bVar6) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
      return (long)(char)~bVar6;
    case 0x18:
      tVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>(this_00,&b,1);
      if (tVar4 != 0) {
        uVar5 = (ulong)b;
LAB_0025d81c:
        return ~uVar5;
      }
      break;
    case 0x19:
      tVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>(this_00,buf_2,2);
      if (tVar4 == 2) {
        uVar5 = (ulong)(ushort)((short)buf_2 << 8 | (ushort)buf_2 >> 8);
        goto LAB_0025d81c;
      }
      break;
    case 0x1a:
      tVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>(this_00,buf,4);
      if (tVar4 == 4) {
        uVar5 = (ulong)((uint)buf >> 0x18 | ((uint)buf & 0xff0000) >> 8 | ((uint)buf & 0xff00) << 8
                       | (int)buf << 0x18);
        goto LAB_0025d81c;
      }
      break;
    case 0x1b:
      tVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
              read<std::input_iterator_tag>(this_00,buf_1,8);
      if (tVar4 == 8) {
        uVar5 = ~(ulong)buf_1;
        return uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      }
      break;
    default:
      goto LAB_0025d832;
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
LAB_0025d832:
  return 0;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }